

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O2

void h262_print_macroblock(h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,int addr)

{
  uint32_t uVar1;
  uint uVar2;
  char **ppcVar3;
  int32_t (*paiVar4) [64];
  ulong uVar5;
  ulong uVar6;
  char *__format;
  ulong uVar7;
  ulong unaff_R13;
  long lVar8;
  ulong uVar9;
  uint32_t (*paauVar10) [2] [2];
  uint32_t (*paauVar11) [2] [2];
  bool bVar12;
  uint local_5c;
  
  local_5c = (uint)addr / picparm->pic_width_in_mbs;
  printf("\tMacroblock %d: (%d, %d)\n",(ulong)(uint)addr,
         (ulong)(uint)addr % (ulong)picparm->pic_width_in_mbs);
  printf("\t\tmacroblock_flags =");
  if (mb->macroblock_skipped != 0) {
    printf(" SKIP");
  }
  if (mb->macroblock_quant != 0) {
    printf(" QUANT");
  }
  if (mb->macroblock_motion_forward != 0) {
    printf(" FWD");
  }
  if (mb->macroblock_motion_backward != 0) {
    printf(" BWD");
  }
  if (mb->macroblock_pattern != 0) {
    printf(" PATTERN");
  }
  if (mb->macroblock_intra != 0) {
    printf(" INTRA");
  }
  putchar(10);
  if (mb->macroblock_intra == 0) {
    bVar12 = picparm->picture_structure != 3;
    ppcVar3 = h262_print_macroblock::fipms;
    if (!bVar12) {
      ppcVar3 = h262_print_macroblock::frpms;
    }
    local_5c = 0;
    __format = "\t\tfield_motion_type = %d [%s]\n";
    if (!bVar12) {
      __format = "\t\tframe_motion_type = %d [%s]\n";
    }
    printf(__format,(ulong)*(uint32_t *)
                            ((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar12 * 4),
           ppcVar3[*(uint32_t *)((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar12 * 4)]
          );
    if ((mb->macroblock_intra != 0) || (mb->macroblock_pattern != 0)) goto LAB_0010546a;
  }
  else {
LAB_0010546a:
    printf("\t\tdct_type = %d\n",(ulong)mb->dct_type);
  }
  printf("\t\tquantiser_scale_code = %d\n",(ulong)mb->quantiser_scale_code);
  if ((mb->macroblock_intra != 0) || (mb->macroblock_skipped != 0)) {
LAB_0010549b:
    printf("\t\tcoded_block_pattern = 0x%x\n",(ulong)mb->coded_block_pattern);
    paiVar4 = mb->block;
    for (uVar7 = 0; (long)uVar7 < (long)h262_macroblock::block_count[seqparm->chroma_format];
        uVar7 = uVar7 + 1) {
      printf("\t\tBlock %d:",uVar7 & 0xffffffff);
      for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 1) {
        printf(" %d",(ulong)(uint)(*paiVar4)[lVar8]);
      }
      putchar(10);
      paiVar4 = paiVar4 + 1;
    }
    return;
  }
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
LAB_00105583:
      uVar7 = 2;
LAB_00105586:
      unaff_R13 = 1;
      local_5c = 0;
      goto LAB_0010558e;
    }
    if (uVar1 != 3) {
      if (uVar1 == 2) {
        local_5c = 1;
        uVar7 = 1;
        unaff_R13 = 1;
        goto LAB_0010558e;
      }
LAB_0010556a:
      uVar7 = 0;
      goto LAB_0010558e;
    }
  }
  else {
    uVar2 = mb->field_motion_type;
    uVar7 = (ulong)uVar2;
    unaff_R13 = 1;
    if (uVar7 == 1) goto LAB_00105586;
    if (uVar2 != 3) {
      if (uVar2 != 2) goto LAB_0010556a;
      goto LAB_00105583;
    }
  }
  local_5c = 1;
  uVar7 = 1;
  unaff_R13 = 0;
LAB_0010558e:
  paauVar10 = mb->motion_residual;
  uVar9 = 0;
LAB_001055a6:
  if (uVar9 != uVar7) {
    uVar6 = 0;
    paauVar11 = paauVar10;
    do {
      if (uVar6 == 0) {
        uVar1 = mb->macroblock_motion_forward;
      }
      else {
        if (uVar6 == 2) goto LAB_00105670;
        uVar1 = mb->macroblock_motion_backward;
      }
      if (uVar1 != 0) {
        if ((local_5c & 1) == 0) {
          printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n",uVar9 & 0xffffffff,
                 uVar6 & 0xffffffff,(ulong)mb->motion_vertical_field_select[uVar9][uVar6]);
        }
        for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
          printf("\t\tmotion_code[%d][%d][%d] = %d\n",uVar9 & 0xffffffff,uVar6 & 0xffffffff,
                 uVar5 & 0xffffffff,(ulong)paauVar11[-2][0][uVar5]);
          printf("\t\tmotion_residual[%d][%d][%d] = %d\n",uVar9 & 0xffffffff,uVar6 & 0xffffffff,
                 uVar5 & 0xffffffff,(ulong)(*paauVar11)[0][uVar5]);
          if ((unaff_R13 & 1) == 0) {
            printf("\t\tdmvector[%d] = %d\n",uVar5 & 0xffffffff,(ulong)mb->dmvector[uVar5]);
          }
        }
      }
      uVar6 = uVar6 + 1;
      paauVar11 = (uint32_t (*) [2] [2])(*paauVar11 + 1);
    } while( true );
  }
  goto LAB_0010549b;
LAB_00105670:
  uVar9 = uVar9 + 1;
  paauVar10 = paauVar10 + 1;
  goto LAB_001055a6;
}

Assistant:

void h262_print_macroblock(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int addr) {
	int i;
	static const int block_count[4] = { 4, 6, 8, 12 };
	static const char *const frpms[] = { "???", "field", "frame", "dual-prime" };
	static const char *const fipms[] = { "???", "field", "16x8", "dual-prime" };
	printf("\tMacroblock %d: (%d, %d)\n", addr, addr % picparm->pic_width_in_mbs, addr / picparm->pic_width_in_mbs);
	printf("\t\tmacroblock_flags =");
	if (mb->macroblock_skipped)
		printf(" SKIP");
	if (mb->macroblock_quant)
		printf(" QUANT");
	if (mb->macroblock_motion_forward)
		printf(" FWD");
	if (mb->macroblock_motion_backward)
		printf(" BWD");
	if (mb->macroblock_pattern)
		printf(" PATTERN");
	if (mb->macroblock_intra)
		printf(" INTRA");
	printf("\n");
	if (!mb->macroblock_intra) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			printf("\t\tframe_motion_type = %d [%s]\n", mb->frame_motion_type, frpms[mb->frame_motion_type]);
		} else {
			printf("\t\tfield_motion_type = %d [%s]\n", mb->field_motion_type, fipms[mb->field_motion_type]);
		}
	}
	if (mb->macroblock_intra || mb->macroblock_pattern)
		printf("\t\tdct_type = %d\n", mb->dct_type);
	printf("\t\tquantiser_scale_code = %d\n", mb->quantiser_scale_code);
	if (!mb->macroblock_intra && !mb->macroblock_skipped) {
		int mvc, mfs, dmv;
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			switch (mb->frame_motion_type) {
				case H262_FRAME_MOTION_FIELD:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_FRAME:
					mvc = 1;
					mfs = 0;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		} else {
			switch (mb->field_motion_type) {
				case H262_FIELD_MOTION_FIELD:
					mvc = 1;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_16X8:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		}
		int r, s, t;
		for (r = 0; r < mvc; r++) {
			for (s = 0; s < 2; s++) {
				if (s == 0 && !mb->macroblock_motion_forward)
					continue;
				if (s == 1 && !mb->macroblock_motion_backward)
					continue;
				if (mfs)
					printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n", r, s, mb->motion_vertical_field_select[r][s]);
				for (t = 0; t < 2; t++) {
					printf("\t\tmotion_code[%d][%d][%d] = %d\n", r, s, t, mb->motion_code[r][s][t]);
					printf("\t\tmotion_residual[%d][%d][%d] = %d\n", r, s, t, mb->motion_residual[r][s][t]);
					if (dmv)
						printf("\t\tdmvector[%d] = %d\n", t, mb->dmvector[t]);
				}
			}
		}
	}
	printf("\t\tcoded_block_pattern = 0x%x\n", mb->coded_block_pattern);
	for (i = 0; i < block_count[seqparm->chroma_format]; i++) {
		printf("\t\tBlock %d:", i);
		int j;
		for (j = 0; j < 64; j++)
			printf(" %d", mb->block[i][j]);
		printf("\n");
	}
}